

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  size_type sVar1;
  size_t sVar2;
  long lVar3;
  long *plVar4;
  Index IVar5;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar6;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_40;
  long *local_38;
  
  if (decl->has_func_type == false) {
    IVar5 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar5 == 0xffffffff) {
      tVar6.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           operator_new(0x48);
      *(long *)((long)tVar6.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
      *(long *)((long)tVar6.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) =
           0;
      sVar1 = (loc->filename).size_;
      sVar2 = (loc->field_1).field_1.offset;
      lVar3 = *(long *)((long)&loc->field_1 + 8);
      *(char **)((long)tVar6.
                       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                       .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) =
           (loc->filename).data_;
      *(size_type *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) = sVar1;
      *(size_t *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = sVar2;
      *(long *)((long)tVar6.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) =
           lVar3;
      *(undefined4 *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
      *(undefined ***)
       tVar6.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           &PTR__TypeModuleField_001a8940;
      MakeUnique<wabt::FuncType>();
      plVar4 = local_38;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)local_38 + 0x50),
                 &(decl->sig).param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)plVar4 + 0x68),
                 &(decl->sig).result_types);
      plVar4 = local_38;
      local_38 = (long *)0x0;
      *(long **)((long)tVar6.
                       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                       .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) =
           plVar4;
      local_40._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           tVar6.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                  *)&local_40);
      if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl !=
          (TypeModuleField *)0x0) {
        (**(code **)(*(long *)local_40._M_t.
                              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                    8))();
      }
      local_40._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           0x0;
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<TypeModuleField>(loc);
      auto func_type = MakeUnique<FuncType>();
      func_type->sig = decl.sig;
      func_type_field->type = std::move(func_type);
      module->AppendField(std::move(func_type_field));
    }
  }
}